

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgdesll(fitsfile *fptr,int colnum,LONGLONG rownum,LONGLONG *length,LONGLONG *heapaddr,
            int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  int iVar3;
  long lVar4;
  long byteloc;
  uint descript4 [2];
  LONGLONG descript8 [2];
  ulong local_50;
  long local_48;
  ulong uStack_40;
  
  local_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_00183d66;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  ptVar2 = pFVar1->tableptr;
  lVar4 = (long)colnum;
  if (-1 < ptVar2[lVar4 + -1].tdatatype) {
    *status = 0x13d;
    return 0x13d;
  }
  byteloc = (rownum + -1) * pFVar1->rowlength + pFVar1->datastart + ptVar2[lVar4 + -1].tbcol;
  if ((ptVar2[lVar4 + -1].tform[0] == 'P') || (ptVar2[lVar4 + -1].tform[1] == 'P')) {
    iVar3 = ffgi4b(fptr,byteloc,2,4,(int *)&local_50,status);
    if (0 < iVar3) goto LAB_00183d66;
    if (length != (LONGLONG *)0x0) {
      *length = local_50 & 0xffffffff;
    }
    if (heapaddr == (LONGLONG *)0x0) goto LAB_00183d66;
    uStack_40 = local_50 >> 0x20;
  }
  else {
    iVar3 = ffgi8b(fptr,byteloc,2,8,&local_48,status);
    if (0 < iVar3) goto LAB_00183d66;
    if (length != (LONGLONG *)0x0) {
      *length = local_48;
    }
    if (heapaddr == (LONGLONG *)0x0) goto LAB_00183d66;
  }
  *heapaddr = uStack_40;
LAB_00183d66:
  return *status;
}

Assistant:

int ffgdesll(fitsfile *fptr,   /* I - FITS file pointer                       */
           int colnum,         /* I - column number (1 = 1st column of table) */
           LONGLONG rownum,        /* I - row number (1 = 1st row of table)       */
           LONGLONG *length,   /* O - number of elements in the row           */
           LONGLONG *heapaddr, /* O - heap pointer to the data                */
           int *status)        /* IO - error status                           */
/*
  get (read) the variable length vector descriptor from the binary table.
  This is similar to ffgdes, except it supports the full 8-byte range of the
  length and offset values in 'Q' columns, as well as 'P' columns.
*/
{
    LONGLONG bytepos;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
       return(*status);
       
    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);   /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    bytepos = (fptr->Fptr)->datastart + 
                  ((fptr->Fptr)->rowlength * (rownum - 1)) +
                   colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptor */
        if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0) 
        {
           if (length)
             *length = (LONGLONG) descript4[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = (LONGLONG) descript4[1]; /* 2nd word is the address */
        }

    }
    else  /* this is for 'Q' columns */
    {
        /* read 8 byte descriptor */
        if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0) 
        {
           if (length)
             *length = descript8[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = descript8[1]; /* 2nd word is the address */
        }
    }     

    return(*status);
}